

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_hole.c
# Opt level: O0

buffer_t * buffer_new(void)

{
  buffer_t *buffer;
  
  buffer = (buffer_t *)malloc(0x28);
  if (buffer == (buffer_t *)0x0) {
    buffer = (buffer_t *)0x0;
  }
  else {
    buffer->fragment = (zip_uint8_t **)0x0;
    buffer->nfragments = 0;
    buffer->fragment_size = 0x2000;
    buffer->size = 0;
    buffer->offset = 0;
  }
  return buffer;
}

Assistant:

static buffer_t *
buffer_new(void) {
    buffer_t *buffer;

    if ((buffer = (buffer_t *)malloc(sizeof(*buffer))) == NULL) {
	return NULL;
    }

    buffer->fragment = NULL;
    buffer->nfragments = 0;
    buffer->fragment_size = FRAGMENT_SIZE;
    buffer->size = 0;
    buffer->offset = 0;

    return buffer;
}